

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O2

void ppMul6(word *c,word *a,word *b,void *stack)

{
  ppMul3(c,a,b,stack);
  ppMul3(c + 6,a + 3,b + 3,stack);
  *(word *)stack = a[3] ^ *a;
  *(word *)((long)stack + 8) = a[4] ^ a[1];
  *(word *)((long)stack + 0x10) = a[5] ^ a[2];
  *(word *)((long)stack + 0x18) = b[3] ^ *b;
  *(word *)((long)stack + 0x20) = b[4] ^ b[1];
  *(word *)((long)stack + 0x28) = b[5] ^ b[2];
  *(word *)((long)stack + 0x30) = c[6] ^ c[3];
  *(word *)((long)stack + 0x38) = c[7] ^ c[4];
  *(word *)((long)stack + 0x40) = c[8] ^ c[5];
  ppMul3(c + 3,(word *)stack,(word *)((long)stack + 0x18),(void *)((long)stack + 0x48));
  c[3] = c[3] ^ *(ulong *)((long)stack + 0x30) ^ *c;
  c[4] = c[4] ^ *(ulong *)((long)stack + 0x38) ^ c[1];
  c[5] = c[5] ^ *(ulong *)((long)stack + 0x40) ^ c[2];
  c[6] = c[6] ^ *(ulong *)((long)stack + 0x30) ^ c[9];
  c[7] = c[7] ^ *(ulong *)((long)stack + 0x38) ^ c[10];
  c[8] = c[8] ^ *(ulong *)((long)stack + 0x40) ^ c[0xb];
  return;
}

Assistant:

static void ppMul6(word c[12], const word a[6], const word b[6], void* stack)
{
	word* t = (word*)stack;
	ASSERT(wwIsDisjoint2(a, 6, c, 12));
	ASSERT(wwIsDisjoint2(b, 6, c, 12));
	// c1 || c0 <- a0 b0
	ppMul3(c, a, b, t);
	// c3 || c2 <- a1 b1
	ppMul3(c + 6, a + 3, b + 3, t);
	// t0 <- a0 + a1
	t[0] = a[0] ^ a[3];
	t[1] = a[1] ^ a[4];
	t[2] = a[2] ^ a[5];
	// t1 <- b0 + b1
	t[3] = b[0] ^ b[3];
	t[4] = b[1] ^ b[4];
	t[5] = b[2] ^ b[5];
	// t2 <- c1 + c2
	t[6] = c[3] ^ c[6];
	t[7] = c[4] ^ c[7];
	t[8] = c[5] ^ c[8];
	// c2 || c1 <- t0 t1
	ppMul3(c + 3, t, t + 3, t + 9);
	// c1 <- c1 + c0 + w2
	c[3] ^= c[0] ^ t[6];
	c[4] ^= c[1] ^ t[7];
	c[5] ^= c[2] ^ t[8];
	// c2 <- c2 + c3 + w2
	c[6] ^= c[9] ^ t[6];
	c[7] ^= c[10] ^ t[7];
	c[8] ^= c[11] ^ t[8];
}